

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O0

QSharedPointer<QMessageDialogOptions> * __thiscall
QSharedPointer<QMessageDialogOptions>::operator=
          (QSharedPointer<QMessageDialogOptions> *this,QSharedPointer<QMessageDialogOptions> *other)

{
  QSharedPointer<QMessageDialogOptions> *in_RDI;
  long in_FS_OFFSET;
  QSharedPointer<QMessageDialogOptions> copy;
  QSharedPointer<QMessageDialogOptions> *this_00;
  QSharedPointer<QMessageDialogOptions> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.value.ptr = (QMessageDialogOptions *)&DAT_aaaaaaaaaaaaaaaa;
  local_18.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = &local_18;
  QSharedPointer(this_00,in_RDI);
  swap(this_00,in_RDI);
  ~QSharedPointer((QSharedPointer<QMessageDialogOptions> *)0x3bc281);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QSharedPointer &operator=(const QSharedPointer &other) noexcept
    {
        QSharedPointer copy(other);
        swap(copy);
        return *this;
    }